

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apropos.cpp
# Opt level: O3

int main(void)

{
  Port *pPVar1;
  
  pPVar1 = rtosc::Ports::apropos(&ports,"/setstring");
  assert_ptr_eq(ports.ports.super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                super__Vector_impl_data._M_start,pPVar1,"no subtree",0x1c);
  pPVar1 = rtosc::Ports::apropos(&ports,"/subtree1/port");
  assert_ptr_eq(((ports.ports.super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                  super__Vector_impl_data._M_start[2].ports)->ports).
                super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                super__Vector_impl_data._M_start,pPVar1,"normal subtree",0x1e);
  pPVar1 = rtosc::Ports::apropos(&ports,"/subtree2/x/port");
  assert_ptr_eq(((ports.ports.super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                  super__Vector_impl_data._M_start[3].ports)->ports).
                super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                super__Vector_impl_data._M_start,pPVar1,"subtree with 2 slashes",0x20);
  pPVar1 = rtosc::Ports::apropos(&ports,"/no/subtree/");
  assert_ptr_eq(ports.ports.super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                super__Vector_impl_data._M_start + 4,pPVar1,"trailing slash without subtree",0x23);
  pPVar1 = rtosc::Ports::apropos(&ports,"/VoicePar1/Enabled");
  assert_ptr_eq((void *)0x0,pPVar1,"array",0x27);
  printf("# %d test(s) failed out of %d (currently passing %f%% tests)\n",
         100.0 - ((double)global_err * 100.0) / (double)test_counter);
  return (uint)(global_err != 0);
}

Assistant:

int main()
{
    const Port *p;
    p = ports.apropos("/setstring");
    assert_ptr_eq(&ports.ports[0], p, "no subtree", __LINE__);
    p = ports.apropos("/subtree1/port");
    assert_ptr_eq(&ports.ports[2].ports->ports[0], p, "normal subtree", __LINE__);
    p = ports.apropos("/subtree2/x/port");
    assert_ptr_eq(&ports.ports[3].ports->ports[0], p, "subtree with 2 slashes", __LINE__);
    // this is not good style, but it still shall not cause memory errors:
    p = ports.apropos("/no/subtree/");
    assert_ptr_eq(&ports.ports[4], p, "trailing slash without subtree", __LINE__);
    p = ports.apropos("/VoicePar1/Enabled");
    // this is a bug: it should match "&ports.ports[6]", but currently it fails,
    // because it dives into ports.ports[5] and then aborts
    assert_ptr_eq(nullptr, p, "array", __LINE__);

    return test_summary();
}